

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O0

void __thiscall
dlib::list_box_helper::list_box<std::__cxx11::string>::
load<dlib::queue_sort_1<dlib::queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::string,dlib::memory_manager_stateless_kernel_1<char>>>>>
          (list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,queue_sort_1<dlib::queue_kernel_c<dlib::queue_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_stateless_kernel_1<char>_>_>_>
                 *list)

{
  byte bVar1;
  size_type first;
  data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pdVar2;
  string *psVar3;
  long *in_RSI;
  unsigned_long *in_RDI;
  unsigned_long total_height;
  unsigned_long max_width;
  unsigned_long i;
  auto_mutex M;
  unsigned_long in_stack_000001b8;
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_000001c0;
  rmutex *in_stack_ffffffffffffff58;
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_00;
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffff60;
  unsigned_long in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  unsigned_long *last;
  unsigned_long *width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  font *this_01;
  unsigned_long in_stack_ffffffffffffffc8;
  scrollable_region *in_stack_ffffffffffffffd0;
  rectangle *in_stack_ffffffffffffffd8;
  base_window *in_stack_ffffffffffffffe0;
  
  auto_mutex::auto_mutex((auto_mutex *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::clear(in_stack_ffffffffffffff60);
  this_01 = (font *)0x0;
  last = in_RDI + 0x24c;
  first = (**(code **)(*in_RSI + 0x40))();
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::set_max_size((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                  *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
  (**(code **)(*in_RSI + 0x40))();
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::set_size(in_stack_000001c0,in_stack_000001b8);
  (**(code **)(*in_RSI + 0x18))();
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  width = (unsigned_long *)0x0;
  while( true ) {
    bVar1 = (**(code **)(*in_RSI + 0x38))();
    if ((bVar1 & 1) == 0) break;
    pdVar2 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                           *)(in_RDI + 0x24c),(unsigned_long)this_01);
    pdVar2->is_selected = false;
    psVar3 = (string *)(**(code **)(*in_RSI + 0x28))();
    pdVar2 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                           *)(in_RDI + 0x24c),(unsigned_long)this_01);
    std::__cxx11::string::operator=((string *)pdVar2,psVar3);
    std::__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dlib::font,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x45a531
              );
    this_00 = (array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               *)(in_RDI + 0x24c);
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](this_00,(unsigned_long)this_01);
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](this_00,(unsigned_long)this_01);
    array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](this_00,(unsigned_long)this_01);
    font::compute_size<char,std::char_traits<char>,std::allocator<char>>
              (this_01,str,width,in_RDI,first,(size_type)last);
    pdVar2 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                           *)(in_RDI + 0x24c),(unsigned_long)this_01);
    if (str < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdVar2->width) {
      pdVar2 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
               ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                             *)(in_RDI + 0x24c),(unsigned_long)this_01);
      str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pdVar2->width;
    }
    pdVar2 = array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[]((array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                           *)(in_RDI + 0x24c),(unsigned_long)this_01);
    width = (unsigned_long *)(pdVar2->height + (long)width);
    this_01 = (font *)((long)&this_01->_vptr_font + 1);
  }
  scrollable_region::set_total_rect_size
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(unsigned_long)this_01);
  base_window::invalidate_rectangle(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[0x256] = 0;
  auto_mutex::~auto_mutex((auto_mutex *)0x45a683);
  return;
}

Assistant:

void load (
            const T& list
        )
        {
            auto_mutex M(m);
            items.clear();
            unsigned long i = 0;
            items.set_max_size(list.size());
            items.set_size(list.size());
            list.reset();
            unsigned long max_width = 0;
            unsigned long total_height = 0;
            while (list.move_next())
            {
                items[i].is_selected = false;
                items[i].name = list.element();
                mfont->compute_size(items[i].name,items[i].width, items[i].height);

                if (items[i].width > max_width)
                    max_width = items[i].width;
                total_height += items[i].height;

                ++i;
            }
            set_total_rect_size(max_width, total_height);

            parent.invalidate_rectangle(rect);
            last_selected = 0;
        }